

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::UpdateActiveJoystick(CInput *this)

{
  bool bVar1;
  int iVar2;
  char *b;
  CJoystick *pCVar3;
  CInput *in_RDI;
  long in_FS_OFFSET;
  CJoystick *Joystick;
  range r;
  array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *in_stack_ffffffffffffffd8;
  range local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::size
                    (&in_RDI->m_aJoysticks);
  if (iVar2 != 0) {
    in_RDI->m_pActiveJoystick = (CJoystick *)0x0;
    local_18 = array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::all
                         (in_stack_ffffffffffffffd8);
    while (bVar1 = plain_range<CInput::CJoystick>::empty(&local_18), ((bVar1 ^ 0xffU) & 1) != 0) {
      pCVar3 = plain_range<CInput::CJoystick>::front((plain_range<CInput::CJoystick> *)in_RDI);
      b = CJoystick::GetGUID(pCVar3);
      Config(in_RDI);
      iVar2 = str_comp((char *)in_RDI,b);
      if (iVar2 == 0) {
        in_RDI->m_pActiveJoystick = pCVar3;
        goto LAB_00132c64;
      }
      plain_range<CInput::CJoystick>::pop_front((plain_range<CInput::CJoystick> *)in_RDI);
    }
    if (in_RDI->m_pActiveJoystick == (CJoystick *)0x0) {
      pCVar3 = array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::operator[]
                         (&in_RDI->m_aJoysticks,0);
      in_RDI->m_pActiveJoystick = pCVar3;
    }
  }
LAB_00132c64:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CInput::UpdateActiveJoystick()
{
	if(m_aJoysticks.size() == 0)
		return;
	m_pActiveJoystick = 0x0;
	for(array<CJoystick>::range r = m_aJoysticks.all(); !r.empty(); r.pop_front())
	{
		CJoystick &Joystick = r.front();
		if(str_comp(Joystick.GetGUID(), Config()->m_JoystickGUID) == 0)
		{
			m_pActiveJoystick = &Joystick;
			return;
		}
	}
	// Fall back to first joystick if no match was found
	if(!m_pActiveJoystick)
		m_pActiveJoystick = &m_aJoysticks[0];
}